

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Intercom_Control_PDU::SetIntercomCommunicationParameters
          (Intercom_Control_PDU *this,
          vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
          *ICP)

{
  pointer pIVar1;
  KUINT16 KVar2;
  pointer this_00;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ::operator=(&this->m_vICP,ICP);
  pIVar1 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_vICP).
                 super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar1; this_00 = this_00 + 1
      ) {
    KVar2 = DATA_TYPE::IntercomCommunicationParameters::GetLength(this_00);
    (this->super_Header).super_Header6.m_ui16PDULength =
         KVar2 + (this->super_Header).super_Header6.m_ui16PDULength + 4;
  }
  return;
}

Assistant:

void Intercom_Control_PDU::SetIntercomCommunicationParameters( const vector<IntercomCommunicationParameters> & ICP )
{
    m_ui16PDULength = INTERCOM_CONTROL_PDU_SIZE;

    m_vICP = ICP;

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();

    for( ; citr != citrEnd; ++citr )
    {
        // Calculate the PDU length.
        m_ui16PDULength += citr->GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    }
}